

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_hook(lua_State *L,int event,int line)

{
  lua_Hook p_Var1;
  CallInfo *pCVar2;
  StkId pTVar3;
  StkId pTVar4;
  StkId pTVar5;
  long lVar6;
  lua_Debug ar;
  
  p_Var1 = L->hook;
  if ((p_Var1 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pTVar5 = L->top;
    pCVar2 = L->ci;
    pTVar3 = L->stack;
    lVar6 = (long)pTVar5 - (long)pTVar3;
    pTVar4 = pCVar2->top;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = pCVar2;
    if ((long)L->stack_last - (long)pTVar5 < 0x150) {
      luaD_growstack(L,0x14);
      pTVar5 = L->top;
    }
    pCVar2->top = pTVar5 + 0x14;
    L->allowhook = '\0';
    *(byte *)&pCVar2->callstatus = (byte)pCVar2->callstatus | 4;
    (*p_Var1)(L,&ar);
    L->allowhook = '\x01';
    pTVar5 = L->stack;
    pCVar2->top = (StkId)(((long)pTVar4 - (long)pTVar3) + (long)pTVar5);
    L->top = (StkId)(lVar6 + (long)pTVar5);
    *(byte *)&pCVar2->callstatus = (byte)pCVar2->callstatus & 0xfb;
  }
  return;
}

Assistant:

void luaD_hook(lua_State *L, int event, int line) {
    lua_Hook hook = L->hook;
    if (hook && L->allowhook) {  /* make sure there is a hook */
        CallInfo *ci = L->ci;
        ptrdiff_t top = savestack(L, L->top);
        ptrdiff_t ci_top = savestack(L, ci->top);
        lua_Debug ar;
        ar.event = event;
        ar.currentline = line;
        ar.i_ci = ci;
        luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
        ci->top = L->top + LUA_MINSTACK;
        lua_assert(ci->top <= L->stack_last);
        L->allowhook = 0;  /* cannot call hooks inside a hook */
        ci->callstatus |= CIST_HOOKED;
        lua_unlock(L);
        (*hook)(L, &ar);
        lua_lock(L);
        lua_assert(!L->allowhook);
        L->allowhook = 1;
        ci->top = restorestack(L, ci_top);
        L->top = restorestack(L, top);
        ci->callstatus &= ~CIST_HOOKED;
    }
}